

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::Params::Params
          (Params *this,string *name,string *description,RobustAccessType *robustAccessType,
          ContextResetType *contextResetType,FixedFunctionType *fixedFunctionType)

{
  pointer pcVar1;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_description,pcVar1,pcVar1 + description->_M_string_length);
  this->m_robustAccessType = *robustAccessType;
  this->m_contextResetType = *contextResetType;
  this->m_fixedFunctionType = *fixedFunctionType;
  return;
}

Assistant:

RobustnessTestCase::Params::Params (const string&				name,
									const string&				description,
									const RobustAccessType&		robustAccessType,
									const ContextResetType&		contextResetType,
									const FixedFunctionType&	fixedFunctionType)
	: m_name				(name)
	, m_description			(description)
	, m_robustAccessType	(robustAccessType)
	, m_contextResetType	(contextResetType)
	, m_fixedFunctionType	(fixedFunctionType)
{
}